

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O2

dropt_error
handle_ip_address(dropt_context *context,dropt_option *option,dropt_char *optionArgument,void *dest)

{
  uint *puVar1;
  int iVar2;
  dropt_error dVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  long lVar6;
  byte bVar7;
  uint octet [4];
  
  if (dest == (void *)0x0) {
    __assert_fail("out != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/test_dropt.c"
                  ,0xaa,
                  "dropt_error handle_ip_address(dropt_context *, const dropt_option *, const dropt_char *, void *)"
                 );
  }
  dVar3 = 5;
  if ((optionArgument != (dropt_char *)0x0) && (bVar7 = *optionArgument, bVar7 != 0)) {
    ppuVar4 = __ctype_b_loc();
    pbVar5 = (byte *)(optionArgument + 1);
    while (bVar7 != 0) {
      if ((bVar7 != 0x2e) && (((*ppuVar4)[bVar7] & 0x800) == 0)) {
        return 0x80;
      }
      bVar7 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    }
    iVar2 = __isoc99_sscanf(optionArgument,"%u.%u.%u.%u",octet,octet + 1,octet + 2,octet + 3);
    dVar3 = 0x80;
    if (iVar2 == 4) {
      lVar6 = 0;
      do {
        if (lVar6 == 4) {
          *(uint *)dest = octet[2] << 8 | octet[1] << 0x10 | octet[0] << 0x18 | octet[3];
          return 0;
        }
        puVar1 = octet + lVar6;
        lVar6 = lVar6 + 1;
      } while (*puVar1 < 0x100);
    }
  }
  return dVar3;
}

Assistant:

static dropt_error
handle_ip_address(dropt_context* context,
                  const dropt_option* option,
                  const dropt_char* optionArgument,
                  void* dest)
{
    dropt_error err = dropt_error_none;
    unsigned int octet[4];
    size_t i;

    unsigned int* out = dest;

    assert(out != NULL);

    if (optionArgument == NULL || optionArgument[0] == T('\0'))
    {
        err = dropt_error_insufficient_arguments;
        goto exit;
    }

    {
        const dropt_char* p = optionArgument;
        while (*p != T('\0'))
        {
            if (!istdigit(*p) && *p != T('.'))
            {
                err = my_dropt_error_bad_ip_address;
                goto exit;
            }
            p++;
        }
    }

    if (stscanf(optionArgument, T("%u.%u.%u.%u"),
                &octet[0], &octet[1], &octet[2], &octet[3])
        != ARRAY_LENGTH(octet))
    {
        err = my_dropt_error_bad_ip_address;
        goto exit;
    }

    for (i = 0; i < ARRAY_LENGTH(octet); i++)
    {
        if (octet[i] > 0xFF)
        {
            err = my_dropt_error_bad_ip_address;
            goto exit;
        }
    }

    *out = (octet[0] << 24) | (octet[1] << 16) | (octet[2] << 8) | octet[3];

exit:
    return err;
}